

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

int av1_alloc_above_context_buffers
              (CommonContexts *above_contexts,int num_tile_rows,int num_mi_cols,int num_planes)

{
  ENTROPY_CONTEXT **ppEVar1;
  PARTITION_CONTEXT **ppPVar2;
  TXFM_CONTEXT **ppTVar3;
  ENTROPY_CONTEXT *pEVar4;
  PARTITION_CONTEXT *pPVar5;
  TXFM_CONTEXT *pTVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  size_t num;
  size_t num_00;
  uint local_40;
  
  uVar9 = num_mi_cols + 0x1fU & 0xffffffe0;
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = uVar9;
  above_contexts->num_planes = num_planes;
  num_00 = (size_t)num_tile_rows;
  if (0 < num_planes) {
    uVar7 = 0;
    do {
      ppEVar1 = (ENTROPY_CONTEXT **)aom_calloc(num_00,8);
      above_contexts->entropy[uVar7] = ppEVar1;
      if (ppEVar1 == (ENTROPY_CONTEXT **)0x0) {
        return 1;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)num_planes != uVar7);
  }
  ppPVar2 = (PARTITION_CONTEXT **)aom_calloc(num_00,8);
  above_contexts->partition = ppPVar2;
  local_40 = 1;
  if (ppPVar2 != (PARTITION_CONTEXT **)0x0) {
    ppTVar3 = (TXFM_CONTEXT **)aom_calloc(num_00,8);
    above_contexts->txfm = ppTVar3;
    if (ppTVar3 != (TXFM_CONTEXT **)0x0) {
      if (num_tile_rows < 1) {
        local_40 = 0;
      }
      else {
        num = (size_t)(int)uVar9;
        local_40 = 1;
        uVar7 = 0;
        do {
          if (0 < num_planes) {
            uVar8 = 0;
            do {
              pEVar4 = (ENTROPY_CONTEXT *)aom_calloc(num,1);
              above_contexts->entropy[uVar8][uVar7] = pEVar4;
              if (above_contexts->entropy[uVar8][uVar7] == (ENTROPY_CONTEXT *)0x0) {
                return local_40;
              }
              uVar8 = uVar8 + 1;
            } while ((uint)num_planes != uVar8);
          }
          pPVar5 = (PARTITION_CONTEXT *)aom_calloc(num,1);
          above_contexts->partition[uVar7] = pPVar5;
          if (above_contexts->partition[uVar7] == (PARTITION_CONTEXT *)0x0) {
            return local_40;
          }
          pTVar6 = (TXFM_CONTEXT *)aom_calloc(num,1);
          above_contexts->txfm[uVar7] = pTVar6;
          if (above_contexts->txfm[uVar7] == (TXFM_CONTEXT *)0x0) {
            return local_40;
          }
          uVar7 = uVar7 + 1;
          local_40 = (uint)((long)uVar7 < (long)num_00);
        } while (uVar7 != (uint)num_tile_rows);
      }
    }
  }
  return local_40;
}

Assistant:

int av1_alloc_above_context_buffers(CommonContexts *above_contexts,
                                    int num_tile_rows, int num_mi_cols,
                                    int num_planes) {
  const int aligned_mi_cols =
      ALIGN_POWER_OF_TWO(num_mi_cols, MAX_MIB_SIZE_LOG2);

  // Allocate above context buffers
  above_contexts->num_tile_rows = num_tile_rows;
  above_contexts->num_mi_cols = aligned_mi_cols;
  above_contexts->num_planes = num_planes;
  for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
    above_contexts->entropy[plane_idx] = (ENTROPY_CONTEXT **)aom_calloc(
        num_tile_rows, sizeof(above_contexts->entropy[0]));
    if (!above_contexts->entropy[plane_idx]) return 1;
  }

  above_contexts->partition = (PARTITION_CONTEXT **)aom_calloc(
      num_tile_rows, sizeof(above_contexts->partition));
  if (!above_contexts->partition) return 1;

  above_contexts->txfm =
      (TXFM_CONTEXT **)aom_calloc(num_tile_rows, sizeof(above_contexts->txfm));
  if (!above_contexts->txfm) return 1;

  for (int tile_row = 0; tile_row < num_tile_rows; tile_row++) {
    for (int plane_idx = 0; plane_idx < num_planes; plane_idx++) {
      above_contexts->entropy[plane_idx][tile_row] =
          (ENTROPY_CONTEXT *)aom_calloc(
              aligned_mi_cols, sizeof(*above_contexts->entropy[0][tile_row]));
      if (!above_contexts->entropy[plane_idx][tile_row]) return 1;
    }

    above_contexts->partition[tile_row] = (PARTITION_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->partition[tile_row]));
    if (!above_contexts->partition[tile_row]) return 1;

    above_contexts->txfm[tile_row] = (TXFM_CONTEXT *)aom_calloc(
        aligned_mi_cols, sizeof(*above_contexts->txfm[tile_row]));
    if (!above_contexts->txfm[tile_row]) return 1;
  }

  return 0;
}